

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_handler.cpp
# Opt level: O2

ssize_t __thiscall TokenReader::read(TokenReader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 in_register_00000034;
  long *plVar2;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  *(undefined4 *)this = 0x10;
  *(TokenReader **)(this + 8) = this + 0x18;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x18] = (TokenReader)0x0;
  iVar1 = (int)plVar2[3];
  if ((ulong)(long)iVar1 < (ulong)((plVar2[1] - *plVar2) / 0x28)) {
    *(int *)(plVar2 + 3) = iVar1 + 1;
    Token::operator=((Token *)this,(Token *)(*plVar2 + (long)iVar1 * 0x28));
  }
  return (ssize_t)this;
}

Assistant:

Token TokenReader::read()
{
    Token token;
    /*std::vector<Token>::iterator iter = m_tokenList.begin();
    if (iter != m_tokenList.end()) {
        token = *iter;
        m_tokenList.erase(iter);
    }*/
    //Modify the implementation of this method mainly because backtrack is supported
    //So the "read" cannot really erase the item, just a position movement.
    if (pos < m_tokenList.size())
        token = m_tokenList[pos++];
    return token;
}